

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Apu.cpp
# Opt level: O2

void __thiscall Sap_Apu::write_data(Sap_Apu *this,blip_time_t time,uint addr,int data)

{
  uint uVar1;
  
  run_until(this,time);
  uVar1 = addr >> 1 ^ 0x6900;
  if (uVar1 < 4) {
    this->oscs[uVar1].regs[addr & 1] = (uchar)data;
  }
  else if (addr == 0xd209) {
    this->oscs[0].delay = 0;
    this->oscs[1].delay = 0;
    this->oscs[2].delay = 0;
    this->oscs[3].delay = 0;
  }
  else if (addr == 0xd208) {
    this->control = data;
  }
  return;
}

Assistant:

void Sap_Apu::write_data( blip_time_t time, unsigned addr, int data )
{
	run_until( time );
	int i = (addr ^ 0xD200) >> 1;
	if ( i < osc_count )
	{
		oscs [i].regs [addr & 1] = data;
	}
	else if ( addr == 0xD208 )
	{
		control = data;
	}
	else if ( addr == 0xD209 )
	{
		oscs [0].delay = 0;
		oscs [1].delay = 0;
		oscs [2].delay = 0;
		oscs [3].delay = 0;
	}
	/*
	// TODO: are polynomials reset in this case?
	else if ( addr == 0xD20F )
	{
		if ( (data & 3) == 0 )
			polym_pos = 0;
	}
	*/
}